

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool __thiscall JetHead::Path::isDir(Path *this)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [4];
  int res;
  stat buf;
  Path *this_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)this;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a8);
  if ((iVar1 == 0) && (((uint)buf.st_nlink & 0x4000) != 0)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Path::isDir()
{
	struct stat buf;
	
	int res = stat( mPath.c_str(), &buf );
	
	if ( res == 0 && (buf.st_mode & S_IFDIR) )
		return true;
	else 
		return false;
}